

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *manager;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *this;
  XSerializeEngine *manager_00;
  XercesAttGroupInfo *valueToAdopt;
  XMLStringPool *pXVar2;
  void *pvVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  XMLSize_t itemIndex;
  ulong uVar4;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  
  manager_00 = serEng;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&hashModulus);
    this = *objToLoad;
    if (this == (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *)0x0) {
      manager = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,manager);
      manager_00 = (XSerializeEngine *)XSerializeEngine::getMemoryManager(serEng);
      RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::RefHashTableOf
                (this,hashModulus,toAdopt,(MemoryManager *)manager_00);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    itemNumber = 0;
    XSerializeEngine::readSize(serEng,&itemNumber);
    pvVar3 = extraout_RDX;
    for (uVar4 = 0; uVar4 < itemNumber; uVar4 = uVar4 + 1) {
      valueToAdopt = (XercesAttGroupInfo *)
                     XSerializeEngine::read(serEng,0x434520,pvVar3,(size_t)manager_00);
      pXVar2 = XSerializeEngine::getStringPool(serEng);
      manager_00 = (XSerializeEngine *)(pXVar2->super_XSerializable)._vptr_XSerializable;
      pvVar3 = (void *)(*(code *)manager_00->fStorePool)(pXVar2,valueToAdopt->fNameId);
      RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::put
                (*objToLoad,pvVar3,valueToAdopt);
      pvVar3 = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<XercesAttGroupInfo>** objToLoad
                                   , int
                                   , bool                                 toAdopt
                                   , XSerializeEngine&                    serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<XercesAttGroupInfo>(
                                                                hashModulus
                                                              , toAdopt
                                                              , serEng.getMemoryManager()
                                                              );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            XercesAttGroupInfo*  data;
            serEng>>data;

            XMLCh* key = (XMLCh*) serEng.getStringPool()->getValueForId(data->getNameId());
            (*objToLoad)->put((void*)key, data);
        }
    }
}